

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int align_buffer_end(flatcc_builder_t *B,uint16_t *align,uint16_t block_align,int is_nested)

{
  uint uVar1;
  undefined6 in_register_00000012;
  ulong uVar2;
  uint uVar3;
  flatcc_iov_state_t iov;
  flatcc_iovec_t local_88 [8];
  
  uVar2 = CONCAT62(in_register_00000012,block_align);
  if ((int)uVar2 == 0) {
    uVar2 = (ulong)(*(int *)&B->block_align + (uint)((short)*(int *)&B->block_align == 0));
  }
  if (*align < 4) {
    *align = 4;
  }
  if (*align < (ushort)uVar2) {
    *align = (ushort)uVar2;
  }
  if (is_nested == 0) {
    uVar1 = B->emit_end;
    uVar3 = *align - 1 & uVar1;
    local_88[0].iov_len = (size_t)uVar3;
    if (uVar3 != 0) {
      local_88[0].iov_base = "";
      B->emit_end = uVar3 + uVar1;
      if ((int)uVar3 < 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2af,
                      "flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)");
      }
      uVar3 = (*B->emit)(B->emit_context,local_88,1,uVar1,local_88[0].iov_len);
      B = (flatcc_builder_t *)(ulong)uVar3;
      if (uVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2b3,
                      "flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)");
      }
      if (uVar1 == 0xffffffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x2cd,"int align_buffer_end(flatcc_builder_t *, uint16_t *, uint16_t, int)");
      }
    }
  }
  return (int)B;
}

Assistant:

static int align_buffer_end(flatcc_builder_t *B, uint16_t *align, uint16_t block_align, int is_nested)
{
    size_t end_pad;
    iov_state_t iov;

    block_align = block_align ? block_align : B->block_align ? B->block_align : 1;
    get_min_align(align, field_size);
    get_min_align(align, block_align);
    /* Pad end of buffer to multiple. */
    if (!is_nested) {
        end_pad = back_pad(B, *align);
        if (end_pad) {
            init_iov();
            push_iov(_pad, end_pad);
            if (0 == emit_back(B, &iov)) {
                check(0, "emitter rejected buffer content");
                return -1;
            }
        }
    }
    return 0;
}